

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

u32 HighsHashHelpers::modexp_M31(u32 a,u64 e)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)a;
  for (; e != 1; e = e >> 1) {
    uVar1 = (uVar2 & 0xffffffff) * (uVar2 & 0xffffffff);
    uVar1 = (uVar1 >> 0x1f) * -0x7fffffff + uVar1;
    uVar2 = uVar1 + 0x80000001;
    if (uVar1 < 0x7fffffff) {
      uVar2 = uVar1;
    }
    if ((e & 1) != 0) {
      uVar1 = (uVar2 & 0xffffffff) * (ulong)a;
      uVar1 = (uVar1 >> 0x1f) * -0x7fffffff + uVar1;
      uVar2 = uVar1 + 0x80000001;
      if (uVar1 < 0x7fffffff) {
        uVar2 = uVar1;
      }
    }
  }
  return (u32)uVar2;
}

Assistant:

static u32 modexp_M31(u32 a, u64 e) {
    // the exponent need to be greater than zero
    assert(e > 0);
    u32 result = a;

    while (e != 1) {
      // square
      result = multiply_modM31(result, result);

      // multiply with a if exponent is odd
      if (e & 1) result = multiply_modM31(result, a);

      // shift to next bit
      e = e >> 1;
    }

    return result;
  }